

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::IsWindowChildOf(ImGuiWindow *window,ImGuiWindow *potential_parent,bool popup_hierarchy)

{
  bool bVar1;
  ImGuiWindow *pIVar2;
  
  pIVar2 = GetCombinedRootWindow(window,popup_hierarchy);
  bVar1 = true;
  if (pIVar2 != potential_parent) {
    for (; window != (ImGuiWindow *)0x0; window = window->ParentWindow) {
      if (window == potential_parent) {
        return true;
      }
      if (window == pIVar2) break;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ImGui::IsWindowChildOf(ImGuiWindow* window, ImGuiWindow* potential_parent, bool popup_hierarchy)
{
    ImGuiWindow* window_root = GetCombinedRootWindow(window, popup_hierarchy);
    if (window_root == potential_parent)
        return true;
    while (window != NULL)
    {
        if (window == potential_parent)
            return true;
        if (window == window_root) // end of chain
            return false;
        window = window->ParentWindow;
    }
    return false;
}